

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall Lexer::Lexer(Lexer *this)

{
  allocator local_11;
  Lexer *local_10;
  Lexer *this_local;
  
  this->npos = -1;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->input_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->index_ = 0;
  LexerPosition::LexerPosition(&this->position_);
  this->in_row_comment_ = false;
  this->in_block_comment_ = false;
  this->current_ = this->npos;
  return;
}

Assistant:

Lexer::Lexer() : input_(""), index_(0), in_row_comment_(false), in_block_comment_(false) {
    current_ = npos;
}